

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gzgetc(gzFile file)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uchar buf [1];
  byte local_9;
  
  if (((file != (gzFile)0x0) && (*file == 0x1c4f)) && (*(int *)((long)file + 0x6c) == 0)) {
    if (*(int *)((long)file + 0x38) != 0) {
      *(int *)((long)file + 0x38) = *(int *)((long)file + 0x38) + -1;
      *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + 1;
      pbVar1 = *(byte **)((long)file + 0x30);
      *(byte **)((long)file + 0x30) = pbVar1 + 1;
      return (int)*pbVar1;
    }
    iVar2 = gzread(file,&local_9,1);
    uVar3 = 0xffffffff;
    if (0 < iVar2) {
      uVar3 = (uint)local_9;
    }
    return uVar3;
  }
  return -1;
}

Assistant:

int ZEXPORT gzgetc(gzFile file)
{
    int ret;
    unsigned char buf[1];
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* try output buffer (no need to check for skip request) */
    if (state->have) {
        state->have--;
        state->pos++;
        return *(state->next)++;
    }

    /* nothing there -- try gzread() */
    ret = gzread(file, buf, 1);
    return ret < 1 ? -1 : buf[0];
}